

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONStringifier.cpp
# Opt level: O0

Var __thiscall
Js::JSONStringifier::CallReplacerFunction
          (JSONStringifier *this,RecyclableObject *holder,JavascriptString *key,Var value)

{
  RecyclableObject *this_00;
  ThreadContext *threadContext;
  JavascriptMethod entryPoint;
  Var pvVar1;
  Arguments local_88 [2];
  undefined1 local_68 [8];
  AutoReentrancyHandler autoReentrancyHandler;
  Arguments args;
  Var values [3];
  Var value_local;
  JavascriptString *key_local;
  RecyclableObject *holder_local;
  JSONStringifier *this_local;
  
  Arguments::Arguments
            ((Arguments *)&autoReentrancyHandler.m_savedReentrancySafeOrHandled,0,&args.Values);
  autoReentrancyHandler._8_8_ = autoReentrancyHandler._8_8_ & 0xffffffffff000000 | 3;
  *(RecyclableObject **)args.Info = holder;
  *(JavascriptString **)((long)args.Info + 8) = key;
  *(Var *)((long)args.Info + 0x10) = value;
  threadContext = ScriptContext::GetThreadContext(this->scriptContext);
  AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_68,threadContext);
  this_00 = this->replacerFunction;
  entryPoint = RecyclableObject::GetEntryPoint(this_00);
  Arguments::Arguments(local_88,(Arguments *)&autoReentrancyHandler.m_savedReentrancySafeOrHandled);
  pvVar1 = JavascriptFunction::CallFunction<true>(this_00,entryPoint,local_88,false);
  AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_68);
  return pvVar1;
}

Assistant:

Var
JSONStringifier::CallReplacerFunction(_In_opt_ RecyclableObject* holder, _In_ JavascriptString* key, _In_ Var value)
{
    Var values[3];
    Arguments args(0, values);

    args.Info.Count = 3;
    args.Values[0] = holder;
    args.Values[1] = key;
    args.Values[2] = value;

    BEGIN_SAFE_REENTRANT_CALL(this->scriptContext->GetThreadContext())
    {
        return JavascriptFunction::CallFunction<true>(this->replacerFunction, this->replacerFunction->GetEntryPoint(), args);
    }
    END_SAFE_REENTRANT_CALL;
}